

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdLib.cpp
# Opt level: O0

void NULLC::AutoArraySet(NULLCRef x,uint pos,NULLCAutoArray *arr)

{
  char *pcVar1;
  char *pcVar2;
  ExternTypeInfo *pEVar3;
  undefined1 auStack_30 [8];
  NULLCAutoArray n;
  uint newSize;
  uint elemSize;
  NULLCAutoArray *arr_local;
  uint pos_local;
  
  if (arr == (NULLCAutoArray *)0x0) {
    nullcThrowError("ERROR: null pointer access");
  }
  else if (x.typeID == arr->typeID) {
    pEVar3 = FastVector<ExternTypeInfo,_false,_false>::operator[]
                       ((FastVector<ExternTypeInfo,_false,_false> *)(linker + 0x200),arr->typeID);
    n.len = pEVar3->size;
    if (arr->len <= pos) {
      n.ptr._4_4_ = arr->len + 1 + (arr->len >> 1);
      if (n.ptr._4_4_ <= pos) {
        n.ptr._4_4_ = pos;
      }
      AutoArray((NULLCAutoArray *)auStack_30,arr->typeID,n.ptr._4_4_);
      if (CONCAT44(n.typeID,auStack_30._4_4_) == 0) {
        return;
      }
      memcpy((void *)CONCAT44(n.typeID,auStack_30._4_4_),arr->ptr,(ulong)(arr->len * n.len));
      *(ulong *)arr = CONCAT44(auStack_30._4_4_,auStack_30._0_4_);
      *(ulong *)((long)&arr->ptr + 4) = CONCAT44(n.ptr._0_4_,n.typeID);
    }
    memcpy(arr->ptr + n.len * pos,x.ptr,(ulong)n.len);
  }
  else {
    pcVar1 = nullcGetTypeName(x.typeID);
    pcVar2 = nullcGetTypeName(arr->typeID);
    nullcThrowError("ERROR: cannot convert from \'%s\' to an \'auto[]\' element type \'%s\'",pcVar1,
                    pcVar2);
  }
  return;
}

Assistant:

void NULLC::AutoArraySet(NULLCRef x, unsigned pos, NULLCAutoArray* arr)
{
	if(!arr)
	{
		nullcThrowError("ERROR: null pointer access");
		return;
	}
	if(x.typeID != arr->typeID)
	{
		nullcThrowError("ERROR: cannot convert from '%s' to an 'auto[]' element type '%s'", nullcGetTypeName(x.typeID), nullcGetTypeName(arr->typeID));
		return;
	}

	unsigned elemSize = linker->exTypes[arr->typeID].size;
	if(pos >= arr->len)
	{
		unsigned newSize = 1 + arr->len + (arr->len >> 1);
		if(pos >= newSize)
			newSize = pos;
		NULLCAutoArray n;
		AutoArray(&n, arr->typeID, newSize);
		if(!n.ptr)
			return;
		memcpy(n.ptr, arr->ptr, unsigned(arr->len * elemSize));
		*arr = n;
	}
	memcpy(arr->ptr + elemSize * pos, x.ptr, elemSize);
}